

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.h
# Opt level: O3

ON_SubDVertex * __thiscall ON_SubDLevel::AddVertex(ON_SubDLevel *this,ON_SubDVertex *vertex)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ON_SubDVertex *pOVar1;
  
  (this->m_aggregates).m_bDirtyBoundingBox = true;
  if (vertex != (ON_SubDVertex *)0x0) {
    if (this->m_vertex[1] == (ON_SubDVertex *)0x0) {
      this->m_vertex[0] = vertex;
      pOVar1 = (ON_SubDVertex *)0x0;
    }
    else {
      this->m_vertex[1]->m_next_vertex = vertex;
      pOVar1 = this->m_vertex[1];
    }
    vertex->m_prev_vertex = pOVar1;
    this->m_vertex[1] = vertex;
    vertex->m_next_vertex = (ON_SubDVertex *)0x0;
    this->m_vertex_count = this->m_vertex_count + 1;
    if (this->m_vertex_array_count != 0) {
      this->m_vertex_array_count = 0;
      this_00 = (this->m_vertex_array).
                super___shared_ptr<const_ON_SubDVertex_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->m_vertex_array).super___shared_ptr<const_ON_SubDVertex_*,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (this->m_vertex_array).super___shared_ptr<const_ON_SubDVertex_*,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  return vertex;
}

Assistant:

const ON_SubDVertex* AddVertex(class ON_SubDVertex* vertex)
  {
    m_aggregates.m_bDirtyBoundingBox = true;
    if (nullptr == vertex)
      return nullptr;
    if (nullptr == m_vertex[1])
    {
      m_vertex[0] = vertex;
      vertex->m_prev_vertex = nullptr;
    }
    else
    {
      m_vertex[1]->m_next_vertex = vertex;
      vertex->m_prev_vertex = m_vertex[1];
    }
    m_vertex[1] = vertex;
    vertex->m_next_vertex = nullptr;
    m_vertex_count++;
    ResetVertexArray();
    return vertex;
  }